

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * __thiscall
dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block
          (CFGStructurizer *this,CFGNode *header,CFGNode *merge,CFGNode *path)

{
  pointer ppCVar1;
  CFGStructurizer *this_00;
  CFGNode *true_block;
  bool bVar2;
  CFGNode *to;
  pointer ppCVar3;
  ThreadLocalAllocator<char> local_e1;
  CFGStructurizer *local_e0;
  CFGNode *local_d8;
  CFGNode *local_d0;
  CFGNode *p;
  undefined8 local_c0;
  _Manager_type local_b8;
  code *local_b0;
  UnorderedSet<const_CFGNode_*> normal_preds;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  bVar2 = CFGNode::dominates(header,merge);
  if (bVar2) {
    bVar2 = CFGNode::dominates(header,path);
    if (bVar2) {
      bVar2 = query_reachability(this,merge,path);
      if (!bVar2) {
        __assert_fail("query_reachability(*merge, *path)",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x150c,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      bVar2 = CFGNode::dominates(merge,path);
      if (bVar2) {
        __assert_fail("!merge->dominates(path)",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x150d,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      if (header == merge) {
        __assert_fail("header != merge",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x150e,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      if (merge != path) {
        local_d0 = path;
        if (header != path) {
          local_e0 = this;
          local_d8 = merge;
          to = create_ladder_block(this,header,merge,".transpose");
          normal_preds._M_h._M_buckets = &normal_preds._M_h._M_single_bucket;
          normal_preds._M_h._M_bucket_count = 1;
          normal_preds._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          normal_preds._M_h._M_element_count = 0;
          normal_preds._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          normal_preds._M_h._M_rehash_policy._M_next_resize = 0;
          normal_preds._M_h._M_single_bucket = (__node_base_ptr)0x0;
          ppCVar1 = (to->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppCVar3 = (to->pred).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; true_block = local_d0,
              this_00 = local_e0, ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1) {
            p = *ppCVar3;
            std::__detail::
            _Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&normal_preds,&p);
          }
          traverse_dominated_blocks_and_rewrite_branch(local_e0,header,local_d0,to);
          local_c0 = 0;
          local_b0 = std::
                     _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5402:24)>
                     ::_M_invoke;
          local_b8 = std::
                     _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5402:24)>
                     ::_M_manager;
          p = (CFGNode *)&normal_preds;
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_70,"transpose_ladder_phi_",&local_e1);
          std::operator+(&local_50,&local_70,&to->name);
          rewrite_ladder_conditional_branch_from_incoming_blocks
                    (this_00,to,true_block,local_d8,(function<bool_(const_dxil_spv::CFGNode_*)> *)&p
                     ,&local_50);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose(&local_50);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose(&local_70);
          if (local_b8 != (_Manager_type)0x0) {
            (*local_b8)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
          }
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&normal_preds._M_h);
          return to;
        }
        __assert_fail("header != path",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x1510,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      __assert_fail("merge != path",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x150f,
                    "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                   );
    }
  }
  __assert_fail("header->dominates(merge) && header->dominates(path)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x150b,
                "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
               );
}

Assistant:

CFGNode *CFGStructurizer::transpose_code_path_through_ladder_block(
    CFGNode *header, CFGNode *merge, CFGNode *path)
{
	assert(header->dominates(merge) && header->dominates(path));
	assert(query_reachability(*merge, *path));
	assert(!merge->dominates(path));
	assert(header != merge);
	assert(merge != path);
	assert(header != path);

	// Rewrite the merge block into merge.pred where merge.pred will branch to either merge or path.
	auto *ladder = create_ladder_block(header, merge, ".transpose");

	UnorderedSet<const CFGNode *> normal_preds;
	for (auto *p : ladder->pred)
		normal_preds.insert(p);
	traverse_dominated_blocks_and_rewrite_branch(header, path, ladder);
	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder, path, merge, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
		String("transpose_ladder_phi_") + ladder->name);
	return ladder;
}